

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::SetSideDefined
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,int side)

{
  TPZGeoElSide local_48;
  TPZGeoElSideIndex local_30;
  
  local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
  local_48.fGeoEl = &this->super_TPZGeoEl;
  local_48.fSide = side;
  TPZGeoElSideIndex::TPZGeoElSideIndex(&local_30,&local_48);
  this->fNeighbours[side].fGeoElIndex = local_30.fGeoElIndex;
  this->fNeighbours[side].fSide = local_30.fSide;
  return;
}

Assistant:

virtual  void SetSideDefined(int side)  override { fNeighbours[side] = TPZGeoElSide(this,side); }